

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::
getTECode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this,
          _tessellation_primitive_mode primitive_mode)

{
  ulong uVar1;
  string token;
  string primitive_mode_string;
  allocator<char> local_51;
  allocator<char> local_50 [8];
  char *local_48;
  string local_30;
  
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            (&local_30,(TessellationShaderUtils *)(ulong)primitive_mode,primitive_mode);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(PRIMITIVE_MODE) in;\n\nin TC_OUT\n{\n    int tc_invocation_id;\n    int tc_patch_vertices_in;\n    int tc_primitive_id;\n} in_tc[];\n\nout int te_tc_invocation_id;\nout int te_tc_patch_vertices_in;\nout int te_tc_primitive_id;\nout int te_patch_vertices_in;\nout int te_primitive_id;\n\nvoid main()\n{\n    te_tc_invocation_id     = in_tc[gl_PatchVerticesIn-1].tc_invocation_id;\n    te_tc_patch_vertices_in = in_tc[gl_PatchVerticesIn-1].tc_patch_vertices_in;\n    te_tc_primitive_id      = in_tc[gl_PatchVerticesIn-1].tc_primitive_id;\n    te_patch_vertices_in    = gl_PatchVerticesIn;\n    te_primitive_id         = gl_PrimitiveID;\n}"
             ,local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"PRIMITIVE_MODE",&local_51);
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_50);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,local_48);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_50);
  }
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::getTECode(
	_tessellation_primitive_mode primitive_mode)
{
	static const char* te_body = "${VERSION}\n"
								 "\n"
								 "${TESSELLATION_SHADER_REQUIRE}\n"
								 "\n"
								 "layout(PRIMITIVE_MODE) in;\n"
								 "\n"
								 "in TC_OUT\n"
								 "{\n"
								 "    int tc_invocation_id;\n"
								 "    int tc_patch_vertices_in;\n"
								 "    int tc_primitive_id;\n"
								 "} in_tc[];\n"
								 "\n"
								 "out int te_tc_invocation_id;\n"
								 "out int te_tc_patch_vertices_in;\n"
								 "out int te_tc_primitive_id;\n"
								 "out int te_patch_vertices_in;\n"
								 "out int te_primitive_id;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    te_tc_invocation_id     = in_tc[gl_PatchVerticesIn-1].tc_invocation_id;\n"
								 "    te_tc_patch_vertices_in = in_tc[gl_PatchVerticesIn-1].tc_patch_vertices_in;\n"
								 "    te_tc_primitive_id      = in_tc[gl_PatchVerticesIn-1].tc_primitive_id;\n"
								 "    te_patch_vertices_in    = gl_PatchVerticesIn;\n"
								 "    te_primitive_id         = gl_PrimitiveID;\n"
								 "}";

	/* Replace PRIMITIVE_MODE with user-provided value */
	std::string		  primitive_mode_string = TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
	std::string		  result				= te_body;
	const std::string token					= "PRIMITIVE_MODE";
	std::size_t		  token_index			= std::string::npos;

	while ((token_index = result.find(token)) != std::string::npos)
	{
		result = result.replace(token_index, token.length(), primitive_mode_string.c_str());

		token_index = result.find(token);
	}

	return result;
}